

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Segment::QueueFrame(Segment *this,Frame *frame)

{
  int iVar1;
  uint uVar2;
  Frame **ppFVar3;
  bool bVar4;
  Frame **ppFVar5;
  ulong uVar6;
  uint uVar7;
  
  iVar1 = this->frames_capacity_;
  uVar2 = this->frames_size_;
  if ((int)uVar2 < iVar1) {
LAB_001563dc:
    iVar1 = this->frames_size_;
    this->frames_size_ = iVar1 + 1;
    this->frames_[iVar1] = frame;
    bVar4 = true;
  }
  else {
    uVar7 = 2;
    if (iVar1 != 0) {
      uVar7 = iVar1 * 2;
    }
    if (0 < (int)uVar7) {
      ppFVar5 = (Frame **)operator_new__((ulong)uVar7 << 3,(nothrow_t *)&std::nothrow);
      if (ppFVar5 != (Frame **)0x0) {
        if (0 < (int)uVar2) {
          ppFVar3 = this->frames_;
          uVar6 = 0;
          do {
            ppFVar5[uVar6] = ppFVar3[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        if (this->frames_ != (Frame **)0x0) {
          operator_delete__(this->frames_);
        }
        this->frames_ = ppFVar5;
        this->frames_capacity_ = uVar7;
        if (ppFVar5 != (Frame **)0x0) goto LAB_001563dc;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Segment::QueueFrame(Frame* frame) {
  const int32_t new_size = frames_size_ + 1;

  if (new_size > frames_capacity_) {
    // Add more frames.
    const int32_t new_capacity = (!frames_capacity_) ? 2 : frames_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    Frame** const frames = new (std::nothrow) Frame*[new_capacity];  // NOLINT
    if (!frames)
      return false;

    for (int32_t i = 0; i < frames_size_; ++i) {
      frames[i] = frames_[i];
    }

    delete[] frames_;
    frames_ = frames;
    frames_capacity_ = new_capacity;
  }

  frames_[frames_size_++] = frame;

  return true;
}